

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http_parser.c
# Opt level: O0

int mk_http_parser_chunked_decode
              (mk_http_parser *p,char *buf_request,size_t buf_request_len,char **out_buf,
              size_t *out_buf_size)

{
  size_t local_58;
  size_t tmp_written_bytes;
  size_t tmp_buf_size;
  char *tmp_buf;
  size_t *psStack_38;
  int ret;
  size_t *out_buf_size_local;
  char **out_buf_local;
  size_t buf_request_len_local;
  char *buf_request_local;
  mk_http_parser *p_local;
  
  tmp_written_bytes = 0;
  local_58 = 0;
  psStack_38 = out_buf_size;
  out_buf_size_local = (size_t *)out_buf;
  out_buf_local = (char **)buf_request_len;
  buf_request_len_local = (size_t)buf_request;
  buf_request_local = (char *)p;
  tmp_written_bytes = mk_http_parser_content_length(p);
  if (tmp_written_bytes == 0) {
    p_local._4_4_ = -1;
  }
  else {
    tmp_buf_size = (size_t)mk_mem_alloc(tmp_written_bytes);
    if ((char *)tmp_buf_size == (char *)0x0) {
      p_local._4_4_ = -1;
    }
    else {
      tmp_buf._4_4_ =
           mk_http_parser_chunked_decode_buf
                     ((mk_http_parser *)buf_request_local,(char *)buf_request_len_local,
                      (size_t)out_buf_local,(char *)tmp_buf_size,tmp_written_bytes,&local_58);
      if (tmp_buf._4_4_ == -1) {
        mk_mem_free((void *)tmp_buf_size);
        p_local._4_4_ = -1;
      }
      else {
        *out_buf_size_local = tmp_buf_size;
        *psStack_38 = local_58;
        p_local._4_4_ = 0;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mk_http_parser_chunked_decode(struct mk_http_parser *p,
                                    char *buf_request, size_t buf_request_len,
                                    char **out_buf, size_t *out_buf_size)
{
    int ret;
    char *tmp_buf;
    size_t tmp_buf_size = 0;
    size_t tmp_written_bytes = 0;

    tmp_buf_size = mk_http_parser_content_length(p);
    if (tmp_buf_size == 0) {
        return -1;
    }

    tmp_buf = mk_mem_alloc(tmp_buf_size);
    if (!tmp_buf) {
        return -1;
    }

    ret = mk_http_parser_chunked_decode_buf(p,
                                            buf_request, buf_request_len,
                                            tmp_buf, tmp_buf_size, &tmp_written_bytes);
    if (ret == -1) {
        mk_mem_free(tmp_buf);
        return -1;
    }

    *out_buf = tmp_buf;
    *out_buf_size = tmp_written_bytes;

    return 0;
}